

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
::_build_from_H(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                *this,ID_index cellID,Tmp_column *column,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *chainsInH)

{
  bool bVar1;
  reference puVar2;
  Column *column_00;
  iterator iStack_50;
  Index idx_h;
  iterator __end0;
  iterator __begin0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *chainsInH_local;
  Tmp_column *column_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
  *pCStack_10;
  ID_index cellID_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
  *this_local;
  
  column_local._4_4_ = cellID;
  pCStack_10 = this;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
            (column,(value_type_conflict *)((long)&column_local + 4));
  __end0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(chainsInH);
  iStack_50 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(chainsInH);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffffb0);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end0);
    column_00 = get_column(this,*puVar2);
    _add_to(this,column_00,column,1);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end0);
  }
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_build_from_H(ID_index cellID,
                                                       Tmp_column& column,
                                                       std::vector<Entry_representative>& chainsInH)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    column.insert(cellID);
    for (Index idx_h : chainsInH) {
      _add_to(get_column(idx_h), column, 1u);
    }
  } else {
    column.emplace(cellID, 1);
    for (std::pair<Index, Field_element>& idx_h : chainsInH) {
      _add_to(get_column(idx_h.first), column, idx_h.second);
    }
  }
}